

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu.c
# Opt level: O2

_Bool run_PPU_cycle(void)

{
  uint16_t uVar1;
  uint16_t scanline;
  uint16_t dot;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint8_t uVar5;
  _Bool _Var6;
  ushort uVar7;
  uint16_t uVar8;
  ushort uVar9;
  uint8_t *puVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  ushort local_40;
  
  uVar1 = ::scanline;
  bVar11 = ::scanline < 0xf0;
  bVar13 = ::scanline == 0x105;
  bVar12 = (ushort)(::dot - 1) < 0x100;
  uVar9 = ::dot - 0x102;
  uVar7 = ::dot & 7;
  local_40 = ::dot - 0x141;
  bVar2 = debug_read_RAM(0x2000);
  bVar3 = debug_read_RAM(0x2001);
  dot = ::dot;
  scanline = ::scanline;
  if ((bVar3 & 0x18) == 0) goto LAB_0010bbdd;
  uVar8 = get_VRAM_address();
  if (uVar1 < 0xf0) {
    if (bVar12) {
      render_pixel((BG_shift_registers *)&execute_ppu_background_regs,scanline,dot);
    }
LAB_0010b8fa:
    if (0xff06 < uVar9 && uVar7 == 1) {
      bVar4 = DAT_00151160._1_1_ >> ((char)uVar8 - 1U & 2 | (byte)(uVar8 >> 4) & 4);
      execute_ppu_background_regs =
           CONCAT12((char)(DAT_0015115c >> 0x18),(ushort)(byte)(DAT_0015115c >> 0x10)) |
           execute_ppu_background_regs;
      DAT_0015115c = CONCAT31(DAT_0015115c._1_3_,bVar4) & 0xffffff01;
      DAT_0015115c = CONCAT22(DAT_0015115c._2_2_,CONCAT11(bVar4 >> 1,(undefined1)DAT_0015115c)) &
                     0xffff01ff;
    }
    if (bVar12) {
      switch(dot & 7) {
      case 1:
        uVar9 = uVar8 & 0xfff | 0x2000;
        puVar10 = (uint8_t *)&DAT_00151160;
        break;
      default:
        goto switchD_0010b98c_caseD_2;
      case 3:
        uVar9 = (uVar8 >> 2 & 7) + (uVar8 >> 4 & 0x38 | uVar8 & 0xc00) + 0x23c0;
        puVar10 = (uint8_t *)((long)&DAT_00151160 + 1);
        break;
      case 5:
        uVar9 = (DAT_00151160 << 4 | uVar8 >> 0xc) & 0xff7 | (ushort)(bVar2 & 0x10) << 8;
        puVar10 = (uint8_t *)((long)&DAT_0015115c + 3);
        break;
      case 7:
        puVar10 = (uint8_t *)((long)&DAT_0015115c + 2);
        uVar9 = (DAT_00151160 & 0xff) << 4 | uVar8 >> 0xc | (ushort)(bVar2 & 0x10) << 8 | 8;
      }
      uVar5 = read_VRAM(uVar9);
      *puVar10 = uVar5;
    }
  }
  else if (bVar11 || bVar13) goto LAB_0010b8fa;
switchD_0010b98c_caseD_2:
  if ((ushort)(dot - 2) < 0x100 || (ushort)(dot - 0x142) < 0x10) {
    execute_ppu_background_regs =
         CONCAT22(execute_ppu_background_regs._2_2_ * 2,(short)execute_ppu_background_regs * 2);
    auVar14 = ZEXT716(CONCAT52(CONCAT41((int)(((uint7)CONCAT21((short)(((uint7)(byte)(DAT_0015115c
                                                                                     >> 0x18) <<
                                                                       0x30) >> 0x28),
                                                               (char)(DAT_0015115c >> 0x10)) << 0x20
                                              ) >> 0x18),(char)(DAT_0015115c >> 8)),
                               (ushort)(byte)DAT_0015115c));
    auVar14 = pshuflw(auVar14,auVar14,0xe1);
    DAT_00151158 = auVar14._0_4_ | CONCAT22(DAT_00151158._2_2_ * 2,(short)DAT_00151158 * 2);
  }
  if (!bVar11 && !bVar13) goto LAB_0010bbdd;
  if ((ushort)(::dot - 1) < 0x40) {
    secondary_OAM_clear(dot);
  }
  if ((uVar1 < 0xf0) && ((ushort)(::dot - 0x41) < 0xc0)) {
    sprite_evaluation(scanline,dot,((bVar2 & 0x20) >> 5) * '\b' + '\b');
  }
  if (0x13f < dot) {
    set_OAM_address('\0');
  }
  if ((ushort)(::dot - 0x101) < 0x40) {
    do_sprite_load(scanline,dot,0,((bVar2 & 0x20) >> 5) * '\b' + '\b');
  }
  if (dot == 0x100) {
    incrementY();
  }
  if (bVar12) {
    if ((dot & 7) == 0) {
LAB_0010bb72:
      incrementX();
    }
  }
  else if (local_40 < 0x10 && (dot & 7) == 0) goto LAB_0010bb72;
  if (dot == 0x101) {
    copyX();
  }
  else if ((ushort)(dot - 0x118) < 0x19 && uVar1 == 0x105) {
    copyY();
  }
  else if (dot == 0x42 && uVar1 == 0x105) {
    clear_sprite0();
  }
  else if (dot == 1 && uVar1 == 0x105) {
    clear_sprite_zero_hit();
    clear_sprite_overflow();
  }
LAB_0010bbdd:
  if (((bVar3 & 8) == 0) || ((::dot == 0x153 & odd_frame & bVar13) != 1)) {
    uVar9 = ::dot + 1;
    if (0x154 < (ushort)(::dot + 1)) {
      if (bVar13) {
        odd_frame = (_Bool)(odd_frame ^ 1);
        ::scanline = 0;
        ::dot = ::dot - 0x154;
        return (_Bool)check_VBlank_vblank;
      }
      ::scanline = ::scanline + 1;
      uVar9 = ::dot - 0x154;
    }
    ::dot = uVar9;
    if (::dot == 1 && ::scanline == 0xf1) {
      set_vblank_bit();
      check_VBlank_vblank = 1;
      _Var6 = is_NMI_set_in_RAM();
      if (_Var6) {
        NMI_flag = 1;
      }
    }
    else if (::scanline == 0x105 && ::dot == 1) {
      clear_vblank_bit();
      check_VBlank_vblank = 0;
    }
  }
  else {
    ::scanline = 0;
    ::dot = 0;
    odd_frame = (_Bool)(odd_frame ^ 1);
  }
  return (_Bool)check_VBlank_vblank;
}

Assistant:

bool run_PPU_cycle() {
    line_status status = get_ppu_line_status(scanline, dot);
    ppu_regs ppu_regs = get_ppu_registers();

    if(is_rendering_enabled(ppu_regs))
        execute_ppu(&ppu_regs, &status, scanline, dot);

    tick(ppu_regs, status, &scanline, &dot);
    return check_VBlank(ppu_regs, scanline, dot, &NMI_flag);
}